

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# carver.cpp
# Opt level: O2

void __thiscall carver::Carver::carveImage(Carver *this,string *outputPath)

{
  Mat target;
  _Vector_base<int,_std::allocator<int>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  _InputArray local_90;
  
  carveImage((Carver *)&stack0xffffffffffffff88);
  local_90.sz.width = 0;
  local_90.sz.height = 0;
  local_90.flags = 0x1010000;
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.obj = (Carver *)&stack0xffffffffffffff88;
  cv::imwrite((string *)outputPath,&local_90,(vector *)&local_c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c8);
  std::operator+(&local_b0,"Saved output image as ",outputPath);
  log_(this,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  cv::Mat::~Mat((Mat *)&stack0xffffffffffffff88);
  return;
}

Assistant:

void Carver::carveImage(string outputPath) {
    cv::Mat target = carveImage();
    cv::imwrite(outputPath, target);
    log_("Saved output image as " + outputPath);
}